

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

void addstr2buff(BuffFS *buff,char *str,size_t slen)

{
  char *__dest;
  
  if (slen < 0x191) {
    __dest = getbuff(buff,(int)slen);
    memcpy(__dest,str,slen);
    buff->blen = buff->blen + (int)slen;
    return;
  }
  pushstr(buff,buff->space,(long)buff->blen);
  buff->blen = 0;
  pushstr(buff,str,slen);
  return;
}

Assistant:

static void addstr2buff (BuffFS *buff, const char *str, size_t slen) {
  if (slen <= BUFVFS) {  /* does string fit into buffer? */
    char *bf = getbuff(buff, cast_int(slen));
    memcpy(bf, str, slen);  /* add string to buffer */
    addsize(buff, cast_int(slen));
  }
  else {  /* string larger than buffer */
    clearbuff(buff);  /* string comes after buffer's content */
    pushstr(buff, str, slen);  /* push string */
  }
}